

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O2

void do_string(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  char *pcVar2;
  CHAR_DATA *ch_00;
  OBJ_DATA *pOVar3;
  size_t sVar4;
  EXTRA_DESCR_DATA *pEVar5;
  char *pcVar6;
  char arg3 [4608];
  char arg2 [4608];
  char arg1 [4608];
  char type [4608];
  
  log_naughty(ch,argument,3);
  smash_tilde(argument);
  pcVar2 = one_argument(argument,type);
  pcVar2 = one_argument(pcVar2,arg1);
  pcVar2 = one_argument(pcVar2,arg2);
  strcpy(arg3,pcVar2);
  if ((((type[0] == '\0') || (arg1[0] == '\0')) || (arg2[0] == '\0')) || (arg3[0] == '\0')) {
    send_to_char("Syntax:\n\r",ch);
    send_to_char("  string char <name> <field> <string>\n\r",ch);
    send_to_char("    fields: name short long desc title spec\n\r",ch);
    send_to_char("  string obj  <name> <field> <string>\n\r",ch);
    pcVar2 = "    fields: name short long extended\n\r";
    goto LAB_002cde99;
  }
  bVar1 = str_prefix(type,"character");
  if ((!bVar1) || (bVar1 = str_prefix(type,"mobile"), !bVar1)) {
    ch_00 = get_char_world(ch,arg1);
    if (ch_00 == (CHAR_DATA *)0x0) {
      pcVar2 = "They aren\'t here.\n\r";
      goto LAB_002cde99;
    }
    ch_00->zone = (AREA_DATA_conflict *)0x0;
    bVar1 = str_prefix(arg2,"name");
    if (!bVar1) {
      free_pstring(ch_00->name);
      pcVar2 = palloc_string(arg3);
      ch_00->name = pcVar2;
      return;
    }
    bVar1 = str_prefix(arg2,"description");
    if (!bVar1) {
      free_pstring(ch_00->description);
      pcVar2 = palloc_string(arg3);
      ch_00->description = pcVar2;
      return;
    }
    bVar1 = str_prefix(arg2,"short");
    if (!bVar1) {
      free_pstring(ch_00->short_descr);
      pcVar2 = palloc_string(arg3);
      ch_00->short_descr = pcVar2;
      return;
    }
    bVar1 = str_prefix(arg2,"long");
    if (!bVar1) {
      free_pstring(ch_00->long_descr);
      sVar4 = strlen(arg3);
      (arg3 + sVar4)[0] = '\n';
      (arg3 + sVar4)[1] = '\r';
      arg3[sVar4 + 2] = '\0';
      pcVar2 = palloc_string(arg3);
      ch_00->long_descr = pcVar2;
      return;
    }
    bVar1 = str_prefix(arg2,"title");
    if (!bVar1) {
      bVar1 = is_npc(ch_00);
      if (!bVar1) {
        set_title(ch_00,arg3);
        return;
      }
      pcVar2 = "Not on NPC\'s.\n\r";
      goto LAB_002cde99;
    }
  }
  bVar1 = str_prefix(type,"object");
  if (!bVar1) {
    pOVar3 = get_obj_world(ch,arg1);
    if (pOVar3 == (OBJ_DATA *)0x0) {
      pcVar2 = "Nothing like that in heaven or earth.\n\r";
    }
    else {
      bVar1 = str_prefix(arg2,"name");
      if (!bVar1) {
        free_pstring(pOVar3->name);
        pcVar2 = palloc_string(arg3);
        pOVar3->name = pcVar2;
        return;
      }
      bVar1 = str_prefix(arg2,"short");
      if (!bVar1) {
        free_pstring(pOVar3->short_descr);
        pcVar2 = palloc_string(arg3);
        pOVar3->short_descr = pcVar2;
        return;
      }
      bVar1 = str_prefix(arg2,"long");
      if (!bVar1) {
        free_pstring(pOVar3->description);
        pcVar2 = palloc_string(arg3);
        pOVar3->description = pcVar2;
        return;
      }
      bVar1 = str_prefix(arg2,"ed");
      if ((bVar1) && (bVar1 = str_prefix(arg2,"extended"), bVar1)) goto LAB_002cdd6d;
      pcVar2 = one_argument(pcVar2,arg3);
      if (pcVar2 != (char *)0x0) {
        sVar4 = strlen(pcVar2);
        (pcVar2 + sVar4)[0] = '\n';
        (pcVar2 + sVar4)[1] = '\r';
        pcVar2[sVar4 + 2] = '\0';
        pEVar5 = new_extra_descr();
        pcVar6 = palloc_string(arg3);
        pEVar5->keyword = pcVar6;
        pcVar2 = palloc_string(pcVar2);
        pEVar5->description = pcVar2;
        pEVar5->next = pOVar3->extra_descr;
        pOVar3->extra_descr = pEVar5;
        return;
      }
      pcVar2 = "Syntax: oset <object> ed <keyword> <string>\n\r";
    }
LAB_002cde99:
    send_to_char(pcVar2,ch);
    return;
  }
LAB_002cdd6d:
  do_string(ch,"");
  return;
}

Assistant:

void do_string(CHAR_DATA *ch, char *argument)
{
	char type[MAX_INPUT_LENGTH];
	char arg1[MAX_INPUT_LENGTH];
	char arg2[MAX_INPUT_LENGTH];
	char arg3[MAX_INPUT_LENGTH];
	CHAR_DATA *victim;
	OBJ_DATA *obj;
	log_naughty(ch, argument, 3);
	smash_tilde(argument);
	argument = one_argument(argument, type);
	argument = one_argument(argument, arg1);
	argument = one_argument(argument, arg2);
	strcpy(arg3, argument);

	if (type[0] == '\0' || arg1[0] == '\0' || arg2[0] == '\0' || arg3[0] == '\0')
	{
		send_to_char("Syntax:\n\r", ch);
		send_to_char("  string char <name> <field> <string>\n\r", ch);
		send_to_char("    fields: name short long desc title spec\n\r", ch);
		send_to_char("  string obj  <name> <field> <string>\n\r", ch);
		send_to_char("    fields: name short long extended\n\r", ch);
		return;
	}

	if (!str_prefix(type, "character") || !str_prefix(type, "mobile"))
	{
		victim = get_char_world(ch, arg1);

		if (victim == nullptr)
		{
			send_to_char("They aren't here.\n\r", ch);
			return;
		}

		/* clear zone for mobs */
		victim->zone = nullptr;

		/* string something */

		if (!str_prefix(arg2, "name"))
		{
			free_pstring(victim->name);
			victim->name = palloc_string(arg3);
			return;
		}

		if (!str_prefix(arg2, "description"))
		{
			free_pstring(victim->description);
			victim->description = palloc_string(arg3);
			return;
		}

		if (!str_prefix(arg2, "short"))
		{
			free_pstring(victim->short_descr);
			victim->short_descr = palloc_string(arg3);
			return;
		}

		if (!str_prefix(arg2, "long"))
		{
			free_pstring(victim->long_descr);
			strcat(arg3, "\n\r");
			victim->long_descr = palloc_string(arg3);
			return;
		}

		if (!str_prefix(arg2, "title"))
		{
			if (is_npc(victim))
			{
				send_to_char("Not on NPC's.\n\r", ch);
				return;
			}

			set_title(victim, arg3);
			return;
		}
	}

	if (!str_prefix(type, "object"))
	{
		/* string an obj */
		obj = get_obj_world(ch, arg1);

		if (obj == nullptr)
		{
			send_to_char("Nothing like that in heaven or earth.\n\r", ch);
			return;
		}

		if (!str_prefix(arg2, "name"))
		{
			free_pstring(obj->name);
			obj->name = palloc_string(arg3);
			return;
		}

		if (!str_prefix(arg2, "short"))
		{
			free_pstring(obj->short_descr);
			obj->short_descr = palloc_string(arg3);
			return;
		}

		if (!str_prefix(arg2, "long"))
		{
			free_pstring(obj->description);
			obj->description = palloc_string(arg3);
			return;
		}

		if (!str_prefix(arg2, "ed") || !str_prefix(arg2, "extended"))
		{
			EXTRA_DESCR_DATA *ed;

			argument = one_argument(argument, arg3);

			if (argument == nullptr)
			{
				send_to_char("Syntax: oset <object> ed <keyword> <string>\n\r", ch);
				return;
			}

			strcat(argument, "\n\r");

			ed = new_extra_descr();

			ed->keyword = palloc_string(arg3);
			ed->description = palloc_string(argument);
			ed->next = obj->extra_descr;
			obj->extra_descr = ed;
			return;
		}
	}

	/* echo bad use message */
	do_string(ch, "");
}